

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlConvertUriToPath(char *uri,char **out)

{
  int iVar1;
  char *pcVar2;
  char *unescaped;
  char *escaped;
  char **out_local;
  char *uri_local;
  
  *out = (char *)0x0;
  iVar1 = xmlStrncasecmp((xmlChar *)uri,(xmlChar *)"file://localhost/",0x11);
  if (iVar1 == 0) {
    unescaped = uri + 0x10;
  }
  else {
    iVar1 = xmlStrncasecmp((xmlChar *)uri,(xmlChar *)"file:///",8);
    if (iVar1 == 0) {
      unescaped = uri + 7;
    }
    else {
      iVar1 = xmlStrncasecmp((xmlChar *)uri,(xmlChar *)"file:/",6);
      if (iVar1 != 0) {
        return 1;
      }
      unescaped = uri + 5;
    }
  }
  pcVar2 = xmlURIUnescapeString(unescaped,0,(char *)0x0);
  if (pcVar2 == (char *)0x0) {
    uri_local._4_4_ = -1;
  }
  else {
    *out = pcVar2;
    uri_local._4_4_ = 0;
  }
  return uri_local._4_4_;
}

Assistant:

static int
xmlConvertUriToPath(const char *uri, char **out) {
    const char *escaped;
    char *unescaped;

    *out = NULL;

    if (!xmlStrncasecmp(BAD_CAST uri, BAD_CAST "file://localhost/", 17)) {
	escaped = &uri[16];
    } else if (!xmlStrncasecmp(BAD_CAST uri, BAD_CAST "file:///", 8)) {
	escaped = &uri[7];
    } else if (!xmlStrncasecmp(BAD_CAST uri, BAD_CAST "file:/", 6)) {
        /* lots of generators seems to lazy to read RFC 1738 */
	escaped = &uri[5];
    } else {
        return(1);
    }

#ifdef _WIN32
    /* Ignore slash like in file:///C:/file.txt */
    escaped += 1;
#endif

    unescaped = xmlURIUnescapeString(escaped, 0, NULL);
    if (unescaped == NULL)
        return(-1);

    *out = unescaped;
    return(0);
}